

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O1

string * to_upper_case(string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_type sVar4;
  string *in_RDI;
  char *pcVar5;
  
  pcVar3 = (str->_M_dataplus)._M_p;
  if (str->_M_string_length == 0) {
    sVar4 = 0;
    pcVar5 = pcVar3;
  }
  else {
    do {
      if (0x19 < (byte)(*pcVar3 + 0xbfU)) {
        *pcVar3 = *pcVar3 + -0x20;
      }
      pcVar3 = pcVar3 + 1;
      pcVar5 = (str->_M_dataplus)._M_p;
      sVar4 = str->_M_string_length;
    } while (pcVar3 != pcVar5 + sVar4);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar2 = *(undefined8 *)((long)&str->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar5;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = sVar4;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string to_upper_case(std::string str) {
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    if(!is_upper_case(*letter)) {
      *letter = to_upper_case(*letter);
    }
  }
  return str;
}